

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::RemoveSpecialShaderAttributes
          (ConversionStream *this)

{
  TokenListType *this_00;
  uint uVar1;
  int iVar2;
  HLSL2GLSLConverterImpl *pHVar3;
  _List_node_base *p_Var4;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var5;
  iterator __position;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var6;
  __node_base_ptr p_Var7;
  uint uVar8;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> Args_1;
  uint uVar9;
  bool bVar10;
  string err;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_98;
  uint local_8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  ConversionStream *local_60;
  int local_54;
  String local_50;
  
  this_00 = &this->m_Tokens;
  local_98._M_node =
       (this->m_Tokens).
       super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_54 = *(int *)&local_98._M_node[1]._M_next;
  if (local_54 == 0x133) {
    local_98._M_node = (local_98._M_node)->_M_next;
  }
  local_8c = (uint)(local_54 == 0x133);
  uVar8 = local_8c;
  local_60 = this;
  if (local_98._M_node == (_List_node_base *)this_00) {
    Args_1._M_node = (_List_node_base *)(ulong)local_8c;
    uVar9 = local_8c;
  }
  else {
    do {
      __position._M_node = local_98._M_node;
      uVar1 = *(uint *)&local_98._M_node[1]._M_next;
      Args_1._M_node = (_List_node_base *)(ulong)uVar1;
      if (uVar1 == 0x134) {
        uVar9 = uVar8 - 1;
        if ((int)uVar8 <= (int)local_8c) break;
      }
      else {
        uVar9 = uVar8;
        if (uVar1 == 0x133) {
          uVar9 = uVar8 + 1;
        }
      }
      uVar8 = uVar1 ^ 0x137 | uVar9;
      Args_1._M_node = (_List_node_base *)(ulong)uVar8;
      if (uVar8 == 0) {
        local_98._M_node = (local_98._M_node)->_M_next;
        if (local_98._M_node != (_List_node_base *)this_00) {
          pHVar3 = local_60->m_Converter;
          HashMapStringKey::HashMapStringKey
                    ((HashMapStringKey *)&local_88,(Char *)local_98._M_node[1]._M_prev,false);
          Args_1._M_node = (_List_node_base *)(local_88._M_string_length & 0x7fffffffffffffff);
          p_Var7 = std::
                   _Hashtable<Diligent::HashMapStringKey,_Diligent::HashMapStringKey,_std::allocator<Diligent::HashMapStringKey>,_std::__detail::_Identity,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::_M_find_before_node
                             (&(pHVar3->m_SpecialShaderAttributes)._M_h,
                              (ulong)Args_1._M_node %
                              (pHVar3->m_SpecialShaderAttributes)._M_h._M_bucket_count,
                              (key_type *)&local_88,(__hash_code)Args_1._M_node);
          if (p_Var7 == (__node_base_ptr)0x0) {
            bVar10 = true;
          }
          else {
            bVar10 = p_Var7->_M_nxt == (_Hash_node_base *)0x0;
          }
          if ((local_88._M_dataplus._M_p != (Char *)0x0) && ((long)local_88._M_string_length < 0)) {
            operator_delete__(local_88._M_dataplus._M_p);
          }
          if (bVar10) goto LAB_002e1585;
          if (local_98._M_node != (_List_node_base *)this_00) {
            iVar2 = *(int *)&local_98._M_node[1]._M_next;
            Args_1._M_node = local_98._M_node;
            while ((local_98._M_node = Args_1._M_node, iVar2 != 0x138 &&
                   (Args_1._M_node = (Args_1._M_node)->_M_next, local_98._M_node = Args_1._M_node,
                   Args_1._M_node != (_List_node_base *)this_00))) {
              iVar2 = *(int *)&Args_1._M_node[1]._M_next;
            }
          }
          if (local_98._M_node != (_List_node_base *)this_00) {
            local_98._M_node = (local_98._M_node)->_M_next;
            _Var5._M_node = local_98._M_node;
            if (local_98._M_node != (_List_node_base *)this_00) {
              std::operator+(&local_88,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &__position._M_node[3]._M_prev,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_98._M_node[3]._M_prev);
              std::__cxx11::string::operator=
                        ((string *)&local_98._M_node[3]._M_prev,(string *)&local_88);
              _Var5._M_node = local_98._M_node;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
                _Var5._M_node = local_98._M_node;
              }
            }
            while (_Var6._M_node = local_98._M_node, bVar10 = local_98._M_node != __position._M_node
                  , local_98._M_node = _Var5._M_node, bVar10) {
              p_Var4 = (__position._M_node)->_M_next;
              std::__cxx11::
              list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
              ::_M_erase(this_00,__position);
              _Var5._M_node = local_98._M_node;
              __position._M_node = p_Var4;
              local_98._M_node = _Var6._M_node;
            }
          }
        }
      }
      else {
LAB_002e1585:
        local_98._M_node = (local_98._M_node)->_M_next;
      }
      uVar8 = uVar9;
    } while (local_98._M_node != (_List_node_base *)this_00);
  }
  if (local_54 == 0x133) {
    if (local_98._M_node == (_List_node_base *)this_00) {
      FormatString<char[38]>(&local_88,(char (*) [38])"Unexpected EOF while processing scope");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_50,local_60,&local_98,4);
      Args_1._M_node = (_List_node_base *)0xd1e;
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessScope",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0xd1e,&local_88,(char (*) [2])0x6e9945,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    if (*(int *)&local_98._M_node[1]._M_next == 0x134) {
      return;
    }
    FormatString<char[26],char[32]>
              (&local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == ClosingParenType",(char (*) [32])Args_1._M_node);
    DebugAssertionFailed
              (local_88._M_dataplus._M_p,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd1f);
  }
  else {
    if (uVar9 == 0) {
      return;
    }
    FormatString<char[20]>(&local_88,(char (*) [20])"Unbalanced brackets");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_50,local_60,&local_98,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessScope",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xd23,&local_88,(char (*) [2])0x6e9945,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::RemoveSpecialShaderAttributes()
{
    auto ScopeStartToken = m_Tokens.begin();
    ProcessScope(
        ScopeStartToken, m_Tokens.end(), TokenType::OpenBrace, TokenType::ClosingBrace,
        [&](TokenListType::iterator& Token, int ScopeDepth) //
        {
            // Search global scope only
            if (ScopeDepth != 0 || Token->Type != TokenType::OpenSquareBracket)
            {
                ++Token;
                return;
            }

            // [numthreads(16, 16, 1)]
            // ^
            auto OpenStaple = Token;
            ++Token;
            if (Token == m_Tokens.end())
                return;
            // [numthreads(16, 16, 1)]
            //  ^
            if (m_Converter.m_SpecialShaderAttributes.find(Token->Literal.c_str()) != m_Converter.m_SpecialShaderAttributes.end())
            {
                while (Token != m_Tokens.end() && Token->Type != TokenType::ClosingSquareBracket)
                    ++Token;
                // [numthreads(16, 16, 1)]
                //                       ^
                if (Token == m_Tokens.end())
                    return;
                ++Token;
                // [numthreads(16, 16, 1)]
                // void CS(uint3 ThreadId  : SV_DispatchThreadID)
                // ^
                if (Token != m_Tokens.end())
                    Token->Delimiter = OpenStaple->Delimiter + Token->Delimiter;
                m_Tokens.erase(OpenStaple, Token);
            }
            else
                ++Token;
        } //
    );
}